

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O3

optional<metaf::TrendGroup> *
metaf::TrendGroup::fromFm(optional<metaf::TrendGroup> *__return_storage_ptr__,string *s)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __s;
  bool bVar1;
  uint uVar2;
  byte bVar3;
  long lVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  char cVar8;
  ulong uVar9;
  int iVar10;
  uint value;
  int iVar11;
  undefined2 local_5c;
  undefined1 local_5a;
  undefined1 local_58 [24];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_40;
  
  if ((fromFm(std::__cxx11::string_const&)::rgx_abi_cxx11_ == '\0') &&
     (iVar10 = __cxa_guard_acquire(&fromFm(std::__cxx11::string_const&)::rgx_abi_cxx11_),
     iVar10 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&fromFm(std::__cxx11::string_const&)::rgx_abi_cxx11_,"FM\\d\\d\\d\\d\\d\\d",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &fromFm(std::__cxx11::string_const&)::rgx_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&fromFm(std::__cxx11::string_const&)::rgx_abi_cxx11_);
  }
  __s._M_current = (s->_M_dataplus)._M_p;
  local_58._16_8_ = (pointer)0x0;
  _Stack_40._M_current = (char *)0x0;
  local_58._0_8_ = (pointer)0x0;
  local_58._8_8_ = (pointer)0x0;
  bVar1 = std::__detail::
          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                    (__s,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(__s._M_current + s->_M_string_length),
                     (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)local_58,&fromFm(std::__cxx11::string_const&)::rgx_abi_cxx11_,0);
  if ((pointer)local_58._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ - local_58._0_8_);
  }
  if (!bVar1) goto LAB_001a5615;
  std::__cxx11::string::substr((ulong)local_58,(ulong)s);
  if ((pointer)local_58._8_8_ == (pointer)0x6) {
    uVar2 = 0;
    lVar4 = 0;
    uVar6 = 0;
    do {
      cVar8 = *(char *)((long)&(((pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_58._0_8_)->first)._M_current + lVar4);
      if ((byte)(cVar8 - 0x3aU) < 0xf6) {
        bVar3 = 0;
        goto LAB_001a552d;
      }
      uVar6 = (uint)(byte)(cVar8 - 0x30) + uVar6 * 10;
      lVar4 = lVar4 + 1;
    } while ((int)lVar4 != 2);
    bVar3 = 1;
    uVar2 = uVar6;
LAB_001a552d:
    lVar4 = 2;
    iVar10 = 0;
    do {
      bVar5 = *(char *)((long)&(((pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_58._0_8_)->first)._M_current + lVar4) - 0x30;
      if (9 < bVar5) {
        iVar10 = 0;
        break;
      }
      iVar10 = (uint)bVar5 + iVar10 * 10;
      lVar4 = lVar4 + 1;
    } while ((int)lVar4 != 4);
    iVar11 = 0;
    lVar4 = 4;
    do {
      cVar8 = *(char *)((long)&(((pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_58._0_8_)->first)._M_current + lVar4);
      if ((byte)(cVar8 - 0x3aU) < 0xf6) goto LAB_001a55af;
      iVar11 = (uint)(byte)(cVar8 - 0x30) + iVar11 * 10;
      lVar4 = lVar4 + 1;
    } while ((int)lVar4 != 6);
    if ((bVar5 < 10 & bVar3) == 0) goto LAB_001a55af;
    uVar9 = (ulong)bVar3 << 0x20;
    uVar7 = (ulong)uVar2;
    cVar8 = '\x01';
  }
  else {
    if ((pointer)local_58._8_8_ == (pointer)0x4) {
      lVar4 = 0;
      iVar10 = 0;
      do {
        cVar8 = *(char *)((long)&(((pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_58._0_8_)->first)._M_current + lVar4);
        bVar3 = cVar8 - 0x3a;
        if (bVar3 < 0xf6) {
          iVar10 = 0;
          break;
        }
        iVar10 = (uint)(byte)(cVar8 - 0x30) + iVar10 * 10;
        lVar4 = lVar4 + 1;
      } while ((int)lVar4 != 2);
      iVar11 = 0;
      lVar4 = 2;
      do {
        cVar8 = *(char *)((long)&(((pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_58._0_8_)->first)._M_current + lVar4);
        if ((byte)(cVar8 - 0x3aU) < 0xf6) goto LAB_001a55af;
        iVar11 = (uint)(byte)(cVar8 - 0x30) + iVar11 * 10;
        lVar4 = lVar4 + 1;
      } while ((int)lVar4 != 4);
      if (bVar3 < 0xf6) goto LAB_001a55af;
      cVar8 = '\x01';
    }
    else {
LAB_001a55af:
      local_5a = 0;
      local_5c = 0;
      iVar10 = 0;
      iVar11 = 0;
      cVar8 = '\0';
    }
    uVar9 = 0;
    uVar7 = 0;
  }
  if ((pointer)local_58._0_8_ != (pointer)(local_58 + 0x10)) {
    operator_delete((void *)local_58._0_8_,
                    (ulong)((long)&(((pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_58._16_8_)->first)._M_current + 1));
  }
  if (cVar8 != '\0') {
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x1f) =
         local_5a;
    *(undefined2 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x1d) =
         local_5c;
    (__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::TrendGroup>._M_payload._M_value.t = FROM;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 4) = 0;
    *(ulong *)((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                      _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0xc) =
         uVar7 | uVar9;
    *(int *)((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                    _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x14) =
         iVar10;
    *(int *)((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                    _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x18) =
         iVar11;
    *(char *)((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                     _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x1c) =
         cVar8;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x30) = 0;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x44) = 0;
    (__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::TrendGroup>._M_engaged = true;
    return __return_storage_ptr__;
  }
LAB_001a5615:
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x3c) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x44) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x30) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x38) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x20) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x28) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x10) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x18) = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::TrendGroup>._M_payload = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 8) = 0;
  return __return_storage_ptr__;
}

Assistant:

std::optional<TrendGroup> TrendGroup::fromFm(const std::string & s) {
	static const std::optional<TrendGroup> notRecognised;
	static const std::regex rgx("FM\\d\\d\\d\\d\\d\\d");
	static const auto posTime = 2, lenTime = 6;
	if (!regex_match(s, rgx)) return notRecognised;
	const auto time = MetafTime::fromStringDDHHMM(s.substr(posTime, lenTime));
	if (!time.has_value()) return notRecognised;

	TrendGroup result;
	result.t = Type::FROM;
	result.tFrom = time;
	return result;
}